

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>::
insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (void *param_1,basic_string_view<char,_std::char_traits<char>_> *param_2,
          undefined8 param_3,undefined8 param_4,undefined8 param_5,undefined8 param_6)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *unaff_retaddr;
  size_t index;
  iterator fnd;
  map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
  *in_stack_ffffffffffffff78;
  InterfaceHandle *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  _Self local_58;
  _Self local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  basic_string_view<char,_std::char_traits<char>_> *args_3;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe8;
  _Storage<unsigned_long,_true> in_stack_fffffffffffffff0;
  bool in_stack_fffffffffffffff8;
  undefined7 in_stack_fffffffffffffff9;
  
  local_48 = param_6;
  local_40 = param_5;
  local_38 = param_4;
  local_30 = param_3;
  args_3 = (basic_string_view<char,_std::char_traits<char>_> *)param_1;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x2a5558);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(&local_50,&local_58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::size
              ((StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *)
               param_1);
    StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
    emplace_back<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              (unaff_retaddr,
               (ValueFederate **)CONCAT71(in_stack_fffffffffffffff9,in_stack_fffffffffffffff8),
               (InterfaceHandle *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,args_3,param_2
              );
    std::
    map<helics::InterfaceHandle,unsigned_long,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
    ::emplace<helics::InterfaceHandle_const&,unsigned_long&>
              ((map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
                *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(unsigned_long *)param_1);
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              ((optional<unsigned_long> *)param_1,(unsigned_long *)in_stack_ffffffffffffff78);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&stack0xfffffffffffffff0);
    uVar2 = extraout_RDX;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = in_stack_fffffffffffffff8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       in_stack_fffffffffffffff0._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            no_search_type /*searchValue1*/,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup2.find(searchValue2);
            if (fnd != lookup2.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            lookup2.emplace(searchValue2, index);
            return index;
        }